

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int ERKStepReInit(void *arkode_mem,ARKRhsFn f,realtype t0,N_Vector y0)

{
  ARKodeMem in_RDX;
  void *in_RSI;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  N_Vector in_stack_ffffffffffffffc8;
  ARKodeMem in_stack_ffffffffffffffd0;
  uint local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(ARKodeERKStepMem *)0x1143ea4);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0->MallocDone == 0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x17,"ARKode::ERKStep","ERKStepReInit",
                      "Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if (in_RSI == (void *)0x0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x16,"ARKode::ERKStep","ERKStepReInit",
                      "Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RDX == (ARKodeMem)0x0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x16,"ARKode::ERKStep","ERKStepReInit",
                      "y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      in_stack_ffffffffffffffc8->content = in_RSI;
      local_4 = arkInit(in_RDX,(realtype)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
      if (local_4 == 0) {
        in_stack_ffffffffffffffc8[1].sunctx = (SUNContext)0x0;
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffd0,(int)(ulong)local_4,"ARKode::ERKStep",
                        "ERKStepReInit","Unable to initialize main ARKode infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int ERKStepReInit(void* arkode_mem, ARKRhsFn f, realtype t0, N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that f is supplied */
  if (f == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check for legal input parameters */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKode state */
  step_mem->f = f;

  /* Initialize main ARKode infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ERKStep", "ERKStepReInit",
                    "Unable to initialize main ARKode infrastructure");
    return(retval);
  }

  /* Initialize all the counters */
  step_mem->nfe = 0;

  return(ARK_SUCCESS);
}